

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Struct.hpp
# Opt level: O0

void __thiscall
Reflection::StructImpl<Analyser::Static::ZX8081::Target>::declare<bool>
          (StructImpl<Analyser::Static::ZX8081::Target> *this,bool *t,string *name)

{
  string *name_local;
  bool *t_local;
  StructImpl<Analyser::Static::ZX8081::Target> *this_local;
  
  declare_emplace<bool>(this,t,name,1);
  return;
}

Assistant:

void declare(Type *t, const std::string &name) {
			// If the declared item is a class, see whether it can be dynamically cast
			// to a reflectable for emplacement. If so, exit early.
			if constexpr (std::is_class<Type>()) {
				if(declare_reflectable(t, name)) return;
			}

			// If the declared item is an array, record it as a pointer to the
			// first element plus a size.
			if constexpr (std::is_array<Type>()) {
				declare_emplace(&(*t)[0], name, sizeof(*t) / sizeof(*t[0]));
				return;
			}

			declare_emplace(t, name);
		}